

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O1

int __thiscall
de::BlockBuffer<unsigned_char>::writeToCurrentBlock
          (BlockBuffer<unsigned_char> *this,int numElements,uchar *elements,bool blocking)

{
  int iVar1;
  uchar *puVar2;
  deBool dVar3;
  int iVar4;
  undefined8 *puVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  if (this->m_writePos == 0) {
    if (blocking) {
      deSemaphore_decrement(this->m_empty);
    }
    else {
      dVar3 = deSemaphore_tryDecrement(this->m_empty);
      if (dVar3 == 0) {
        return 0;
      }
    }
    if (this->m_canceled != 0) {
      deSemaphore_increment(this->m_empty);
      Mutex::unlock(&this->m_writeLock);
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = &PTR__exception_00277ba8;
      __cxa_throw(puVar5,&BufferCanceledException::typeinfo,std::exception::~exception);
    }
  }
  iVar4 = this->m_blockSize;
  uVar7 = iVar4 - this->m_writePos;
  uVar9 = (ulong)uVar7;
  if (numElements < (int)uVar7) {
    uVar9 = (ulong)(uint)numElements;
  }
  iVar8 = (int)uVar9;
  if (0 < iVar8) {
    iVar1 = this->m_writeBlock;
    puVar2 = this->m_elements;
    uVar6 = 0;
    do {
      puVar2[(long)(this->m_writePos + (int)uVar6) + (long)(iVar4 * iVar1)] = elements[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
  }
  iVar4 = this->m_writePos + iVar8;
  this->m_writePos = iVar4;
  if (iVar4 == this->m_blockSize) {
    this->m_numUsedInBlock[this->m_writeBlock] = iVar4;
    this->m_writeBlock = (this->m_writeBlock + 1) % this->m_numBlocks;
    this->m_writePos = 0;
    deSemaphore_increment(this->m_fill);
  }
  return iVar8;
}

Assistant:

int BlockBuffer<T>::writeToCurrentBlock (int numElements, const T* elements, bool blocking)
{
	DE_ASSERT(numElements > 0 && elements != DE_NULL);

	if (m_writePos == 0)
	{
		/* Write thread doesn't own current block - need to acquire. */
		if (blocking)
			deSemaphore_decrement(m_empty);
		else
		{
			if (!deSemaphore_tryDecrement(m_empty))
				return 0;
		}

		/* Check for canceled bit. */
		if (m_canceled)
		{
			// \todo [2012-07-06 pyry] A bit hackish to assume that write lock is not freed if exception is thrown out here.
			deSemaphore_increment(m_empty);
			m_writeLock.unlock();
			throw CanceledException();
		}
	}

	/* Write thread owns current block. */
	T*		block			= m_elements + m_writeBlock*m_blockSize;
	int		numToWrite		= de::min(numElements, m_blockSize-m_writePos);

	DE_ASSERT(numToWrite > 0);

	for (int ndx = 0; ndx < numToWrite; ndx++)
		block[m_writePos+ndx] = elements[ndx];

	m_writePos += numToWrite;

	if (m_writePos == m_blockSize)
		flushWriteBlock(); /* Flush current write block. */

	return numToWrite;
}